

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  Select *p_00;
  ExprList *pEVar1;
  SrcList *pSVar2;
  Expr *pEVar3;
  With *pWVar4;
  Window *pWVar5;
  Select *pNew;
  Select *p;
  Select **pp;
  Select *pNext;
  Select *pRet;
  Select *pSStack_18;
  int flags_local;
  Select *pDup_local;
  sqlite3 *db_local;
  
  pNext = (Select *)0x0;
  pp = (Select **)0x0;
  p = (Select *)&pNext;
  pNew = pDup;
  pRet._4_4_ = flags;
  pSStack_18 = pDup;
  pDup_local = (Select *)db;
  while ((pNew != (Select *)0x0 &&
         (p_00 = (Select *)sqlite3DbMallocRawNN((sqlite3 *)pDup_local,0x80), p_00 != (Select *)0x0))
        ) {
    pEVar1 = sqlite3ExprListDup((sqlite3 *)pDup_local,pNew->pEList,pRet._4_4_);
    p_00->pEList = pEVar1;
    pSVar2 = sqlite3SrcListDup((sqlite3 *)pDup_local,pNew->pSrc,pRet._4_4_);
    p_00->pSrc = pSVar2;
    pEVar3 = sqlite3ExprDup((sqlite3 *)pDup_local,pNew->pWhere,pRet._4_4_);
    p_00->pWhere = pEVar3;
    pEVar1 = sqlite3ExprListDup((sqlite3 *)pDup_local,pNew->pGroupBy,pRet._4_4_);
    p_00->pGroupBy = pEVar1;
    pEVar3 = sqlite3ExprDup((sqlite3 *)pDup_local,pNew->pHaving,pRet._4_4_);
    p_00->pHaving = pEVar3;
    pEVar1 = sqlite3ExprListDup((sqlite3 *)pDup_local,pNew->pOrderBy,pRet._4_4_);
    p_00->pOrderBy = pEVar1;
    p_00->op = pNew->op;
    p_00->pNext = (Select *)pp;
    p_00->pPrior = (Select *)0x0;
    pEVar3 = sqlite3ExprDup((sqlite3 *)pDup_local,pNew->pLimit,pRet._4_4_);
    p_00->pLimit = pEVar3;
    p_00->iLimit = 0;
    p_00->iOffset = 0;
    p_00->selFlags = pNew->selFlags & 0xffffffdf;
    p_00->addrOpenEphm[0] = -1;
    p_00->addrOpenEphm[1] = -1;
    p_00->nSelectRow = pNew->nSelectRow;
    pWVar4 = withDup((sqlite3 *)pDup_local,pNew->pWith);
    p_00->pWith = pWVar4;
    p_00->pWin = (Window *)0x0;
    pWVar5 = sqlite3WindowListDup((sqlite3 *)pDup_local,pNew->pWinDefn);
    p_00->pWinDefn = pWVar5;
    if (pNew->pWin != (Window *)0x0) {
      gatherSelectWindows(p_00);
    }
    p_00->selId = pNew->selId;
    p->pEList = (ExprList *)p_00;
    p = (Select *)&p_00->pPrior;
    pNew = pNew->pPrior;
    pp = (Select **)p_00;
  }
  return pNext;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = withDup(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    pNew->pWin = 0;
    pNew->pWinDefn = sqlite3WindowListDup(db, p->pWinDefn);
    if( p->pWin ) gatherSelectWindows(pNew);
#endif
    pNew->selId = p->selId;
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }

  return pRet;
}